

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_fill_rect_multi_color
               (nk_command_buffer *b,nk_rect rect,nk_color left,nk_color top,nk_color right,
               nk_color bottom)

{
  void *pvVar1;
  float local_48;
  float local_44;
  nk_rect *clip;
  nk_command_rect_multi_color *cmd;
  nk_command_buffer *b_local;
  nk_color bottom_local;
  nk_color right_local;
  nk_color top_local;
  nk_color left_local;
  nk_rect rect_local;
  
  if (b != (nk_command_buffer *)0x0) {
    if (b != (nk_command_buffer *)0x0) {
      rect_local.x = rect.w;
      if ((rect_local.x != 0.0) || (NAN(rect_local.x))) {
        rect_local.y = rect.h;
        if ((rect_local.y != 0.0) || (NAN(rect_local.y))) {
          top_local = (nk_color)rect.x;
          left_local = (nk_color)rect.y;
          if (((b->use_clipping == 0) ||
              (((((b->clip).x <= (float)top_local + rect_local.x &&
                 ((float)top_local <= (b->clip).x + (b->clip).w)) &&
                ((b->clip).y <= (float)left_local + rect_local.y)) &&
               ((float)left_local <= (b->clip).y + (b->clip).h)))) &&
             (pvVar1 = nk_command_buffer_push(b,NK_COMMAND_RECT_MULTI_COLOR,0x28),
             pvVar1 != (void *)0x0)) {
            *(short *)((long)pvVar1 + 0x10) = (short)(int)(float)top_local;
            *(short *)((long)pvVar1 + 0x12) = (short)(int)(float)left_local;
            if (rect_local.x <= 0.0) {
              local_44 = 0.0;
            }
            else {
              local_44 = rect_local.x;
            }
            *(short *)((long)pvVar1 + 0x14) = (short)(int)local_44;
            if (rect_local.y <= 0.0) {
              local_48 = 0.0;
            }
            else {
              local_48 = rect_local.y;
            }
            *(short *)((long)pvVar1 + 0x16) = (short)(int)local_48;
            *(nk_color *)((long)pvVar1 + 0x18) = left;
            *(nk_color *)((long)pvVar1 + 0x1c) = top;
            *(nk_color *)((long)pvVar1 + 0x24) = right;
            *(nk_color *)((long)pvVar1 + 0x20) = bottom;
          }
        }
      }
    }
    return;
  }
  __assert_fail("b",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x22cc,
                "void nk_fill_rect_multi_color(struct nk_command_buffer *, struct nk_rect, struct nk_color, struct nk_color, struct nk_color, struct nk_color)"
               );
}

Assistant:

NK_API void
nk_fill_rect_multi_color(struct nk_command_buffer *b, struct nk_rect rect,
    struct nk_color left, struct nk_color top, struct nk_color right,
    struct nk_color bottom)
{
    struct nk_command_rect_multi_color *cmd;
    NK_ASSERT(b);
    if (!b || rect.w == 0 || rect.h == 0) return;
    if (b->use_clipping) {
        const struct nk_rect *clip = &b->clip;
        if (!NK_INTERSECT(rect.x, rect.y, rect.w, rect.h,
            clip->x, clip->y, clip->w, clip->h)) return;
    }

    cmd = (struct nk_command_rect_multi_color*)
        nk_command_buffer_push(b, NK_COMMAND_RECT_MULTI_COLOR, sizeof(*cmd));
    if (!cmd) return;
    cmd->x = (short)rect.x;
    cmd->y = (short)rect.y;
    cmd->w = (unsigned short)NK_MAX(0, rect.w);
    cmd->h = (unsigned short)NK_MAX(0, rect.h);
    cmd->left = left;
    cmd->top = top;
    cmd->right = right;
    cmd->bottom = bottom;
}